

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O0

void __thiscall
QMimeBinaryProvider::QMimeBinaryProvider
          (QMimeBinaryProvider *this,QMimeDatabasePrivate *db,QString *directory)

{
  undefined8 *in_RDI;
  QString *in_stack_ffffffffffffffb0;
  QMimeDatabasePrivate *in_stack_ffffffffffffffb8;
  QMimeProviderBase *in_stack_ffffffffffffffc0;
  QMimeBinaryProvider *in_stack_ffffffffffffffd8;
  
  QMimeProviderBase::QMimeProviderBase
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  *in_RDI = &PTR__QMimeBinaryProvider_00bef090;
  std::
  unique_ptr<QMimeBinaryProvider::CacheFile,std::default_delete<QMimeBinaryProvider::CacheFile>>::
  unique_ptr<std::default_delete<QMimeBinaryProvider::CacheFile>,void>
            ((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
              *)(in_RDI + 6));
  QList<QString>::QList((QList<QString> *)0x8f8850);
  QSet<QString>::QSet((QSet<QString> *)0x8f8863);
  *(undefined1 *)(in_RDI + 0xb) = 0;
  std::
  map<QString,_QMimeBinaryProvider::MimeTypeExtra,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
  ::map((map<QString,_QMimeBinaryProvider::MimeTypeExtra,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
         *)0x8f887a);
  ensureLoaded(in_stack_ffffffffffffffd8);
  return;
}

Assistant:

QMimeBinaryProvider::QMimeBinaryProvider(QMimeDatabasePrivate *db, const QString &directory)
    : QMimeProviderBase(db, directory), m_mimetypeListLoaded(false)
{
    ensureLoaded();
}